

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeGetOptimalReserve(Btree *p)

{
  int *piVar1;
  u32 uVar2;
  u32 uVar3;
  
  if (p->sharable == '\0') {
    uVar2 = p->pBt->pageSize;
    uVar3 = p->pBt->usableSize;
  }
  else {
    p->wantToLock = p->wantToLock + 1;
    if (p->locked == '\0') {
      btreeLockCarefully(p);
      uVar2 = p->pBt->pageSize;
      uVar3 = p->pBt->usableSize;
      if (p->sharable == '\0') goto LAB_001506b9;
    }
    else {
      uVar2 = p->pBt->pageSize;
      uVar3 = p->pBt->usableSize;
    }
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
LAB_001506b9:
  return uVar2 - uVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeGetOptimalReserve(Btree *p){
  int n;
  sqlite3BtreeEnter(p);
  n = sqlite3BtreeGetReserveNoMutex(p);
#ifdef SQLITE_HAS_CODEC
  if( n<p->pBt->optimalReserve ) n = p->pBt->optimalReserve;
#endif
  sqlite3BtreeLeave(p);
  return n;
}